

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dyndep_parser.cc
# Opt level: O0

bool __thiscall DyndepParser::ParseEdge(DyndepParser *this,string *err)

{
  EvalString *this_00;
  pointer *key_00;
  map<Edge_*,_Dyndeps,_std::less<Edge_*>,_std::allocator<std::pair<Edge_*const,_Dyndeps>_>_>
  *this_01;
  State *pSVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  bool bVar3;
  byte bVar4;
  Edge *pEVar5;
  pointer ppVar6;
  size_type sVar7;
  TokenType *this_02;
  pointer pEVar8;
  pair<std::_Rb_tree_iterator<std::pair<Edge_*const,_Dyndeps>_>,_bool> pVar9;
  StringPiece local_4a8;
  Node *local_498;
  Node *n_1;
  uint64_t slash_bits_2;
  string path_err_2;
  string path_2;
  __normal_iterator<EvalString_*,_std::vector<EvalString,_std::allocator<EvalString>_>_> local_440;
  iterator i_1;
  Node *local_428;
  Node *n;
  uint64_t slash_bits_1;
  string path_err_1;
  string path_1;
  __normal_iterator<EvalString_*,_std::vector<EvalString,_std::allocator<EvalString>_>_> local_3d0;
  iterator i;
  string value;
  string local_3a0;
  undefined1 local_380 [8];
  EvalString val;
  string key;
  string local_340;
  undefined1 local_320 [8];
  EvalString in_1;
  vector<EvalString,_std::allocator<EvalString>_> ins;
  string local_2e8;
  undefined1 local_2c8 [8];
  EvalString in;
  string local_2a8;
  undefined1 local_288 [8];
  string rule_name;
  EvalString out_1;
  vector<EvalString,_std::allocator<EvalString>_> outs;
  string local_230;
  undefined1 local_210 [8];
  EvalString out;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  _Base_ptr local_1b8;
  undefined1 local_1b0;
  Dyndeps local_1a8;
  pair<Edge_*const,_Dyndeps> local_170;
  _Rb_tree_iterator<std::pair<Edge_*const,_Dyndeps>_> local_130;
  pair<std::_Rb_tree_iterator<std::pair<Edge_*const,_Dyndeps>_>,_bool> res;
  Edge *edge;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  StringPiece local_d8;
  Node *local_c8;
  Node *node;
  uint64_t slash_bits;
  string path_err;
  string path;
  string local_70;
  uint local_50;
  undefined1 local_40 [8];
  EvalString out0;
  Dyndeps *dyndeps;
  string *err_local;
  DyndepParser *this_local;
  
  out0.parsed_.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  EvalString::EvalString((EvalString *)local_40);
  bVar3 = Lexer::ReadPath(&(this->super_Parser).lexer_,(EvalString *)local_40,err);
  if (bVar3) {
    bVar3 = EvalString::empty((EvalString *)local_40);
    if (bVar3) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,"expected path",
                 (allocator<char> *)(path.field_2._M_local_buf + 0xf));
      this_local._7_1_ = Lexer::Error(&(this->super_Parser).lexer_,&local_70,err);
      std::__cxx11::string::~string((string *)&local_70);
      std::allocator<char>::~allocator((allocator<char> *)(path.field_2._M_local_buf + 0xf));
      local_50 = 1;
    }
    else {
      EvalString::Evaluate_abi_cxx11_
                ((string *)((long)&path_err.field_2 + 8),(EvalString *)local_40,(Env *)&this->env_);
      std::__cxx11::string::string((string *)&slash_bits);
      bVar3 = CanonicalizePath((string *)((long)&path_err.field_2 + 8),(uint64_t *)&node,
                               (string *)&slash_bits);
      if (bVar3) {
        pSVar1 = (this->super_Parser).state_;
        StringPiece::StringPiece(&local_d8,(string *)((long)&path_err.field_2 + 8));
        local_c8 = State::LookupNode(pSVar1,local_d8);
        if ((local_c8 == (Node *)0x0) || (pEVar5 = Node::in_edge(local_c8), pEVar5 == (Edge *)0x0))
        {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&edge,
                         "no build statement exists for \'",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&path_err.field_2 + 8));
          std::operator+(&local_f8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&edge,
                         "\'");
          this_local._7_1_ = Lexer::Error(&(this->super_Parser).lexer_,&local_f8,err);
          std::__cxx11::string::~string((string *)&local_f8);
          std::__cxx11::string::~string((string *)&edge);
          local_50 = 1;
        }
        else {
          res._8_8_ = Node::in_edge(local_c8);
          this_01 = &this->dyndep_file_->
                     super_map<Edge_*,_Dyndeps,_std::less<Edge_*>,_std::allocator<std::pair<Edge_*const,_Dyndeps>_>_>
          ;
          Dyndeps::Dyndeps(&local_1a8);
          std::pair<Edge_*const,_Dyndeps>::pair<Edge_*&,_Dyndeps,_true>
                    (&local_170,(Edge **)&res.second,&local_1a8);
          pVar9 = std::
                  map<Edge_*,_Dyndeps,_std::less<Edge_*>,_std::allocator<std::pair<Edge_*const,_Dyndeps>_>_>
                  ::insert(this_01,&local_170);
          local_1b8 = (_Base_ptr)pVar9.first._M_node;
          local_1b0 = pVar9.second;
          local_130._M_node = local_1b8;
          res.first._M_node._0_1_ = local_1b0;
          std::pair<Edge_*const,_Dyndeps>::~pair(&local_170);
          Dyndeps::~Dyndeps(&local_1a8);
          if (((byte)res.first._M_node & 1) == 0) {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &out.parsed_.
                            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,
                           "multiple statements for \'",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&path_err.field_2 + 8));
            std::operator+(&local_1d8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &out.parsed_.
                            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,"\'");
            this_local._7_1_ = Lexer::Error(&(this->super_Parser).lexer_,&local_1d8,err);
            std::__cxx11::string::~string((string *)&local_1d8);
            std::__cxx11::string::~string
                      ((string *)
                       &out.parsed_.
                        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
            local_50 = 1;
          }
          else {
            ppVar6 = std::_Rb_tree_iterator<std::pair<Edge_*const,_Dyndeps>_>::operator->
                               (&local_130);
            out0.parsed_.
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&ppVar6->second;
            local_50 = 0;
          }
        }
      }
      else {
        this_local._7_1_ = Lexer::Error(&(this->super_Parser).lexer_,(string *)&slash_bits,err);
        local_50 = 1;
      }
      std::__cxx11::string::~string((string *)&slash_bits);
      std::__cxx11::string::~string((string *)(path_err.field_2._M_local_buf + 8));
    }
  }
  else {
    this_local._7_1_ = 0;
    local_50 = 1;
  }
  EvalString::~EvalString((EvalString *)local_40);
  if (local_50 != 0) goto LAB_001d6356;
  EvalString::EvalString((EvalString *)local_210);
  bVar3 = Lexer::ReadPath(&(this->super_Parser).lexer_,(EvalString *)local_210,err);
  if (bVar3) {
    bVar3 = EvalString::empty((EvalString *)local_210);
    if (bVar3) {
      local_50 = 0;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_230,"explicit outputs not supported",
                 (allocator<char> *)
                 ((long)&outs.super__Vector_base<EvalString,_std::allocator<EvalString>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 7));
      this_local._7_1_ = Lexer::Error(&(this->super_Parser).lexer_,&local_230,err);
      std::__cxx11::string::~string((string *)&local_230);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&outs.super__Vector_base<EvalString,_std::allocator<EvalString>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 7));
      local_50 = 1;
    }
  }
  else {
    this_local._7_1_ = 0;
    local_50 = 1;
  }
  EvalString::~EvalString((EvalString *)local_210);
  if (local_50 != 0) goto LAB_001d6356;
  std::vector<EvalString,_std::allocator<EvalString>_>::vector
            ((vector<EvalString,_std::allocator<EvalString>_> *)
             &out_1.parsed_.
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  bVar3 = Lexer::PeekToken(&(this->super_Parser).lexer_,PIPE);
  if (bVar3) {
    do {
      this_00 = (EvalString *)((long)&rule_name.field_2 + 8);
      EvalString::EvalString(this_00);
      bVar3 = Lexer::ReadPath(&(this->super_Parser).lexer_,this_00,err);
      if (bVar3) {
        bVar3 = EvalString::empty((EvalString *)((long)&rule_name.field_2 + 8));
        if (bVar3) {
          local_50 = 2;
        }
        else {
          std::vector<EvalString,_std::allocator<EvalString>_>::push_back
                    ((vector<EvalString,_std::allocator<EvalString>_> *)
                     &out_1.parsed_.
                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (value_type *)((long)&rule_name.field_2 + 8));
          local_50 = 0;
        }
      }
      else {
        this_local._7_1_ = err != (string *)0x0;
        local_50 = 1;
      }
      EvalString::~EvalString((EvalString *)((long)&rule_name.field_2 + 8));
    } while (local_50 == 0);
    if (local_50 == 2) goto LAB_001d578d;
  }
  else {
LAB_001d578d:
    bVar3 = Parser::ExpectToken(&this->super_Parser,COLON,err);
    if (bVar3) {
      std::__cxx11::string::string((string *)local_288);
      bVar3 = Lexer::ReadIdent(&(this->super_Parser).lexer_,(string *)local_288);
      if ((!bVar3) ||
         (bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_288,"dyndep"), bVar3)) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2a8,"expected build command name \'dyndep\'",
                   (allocator<char> *)
                   ((long)&in.parsed_.
                           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        this_local._7_1_ = Lexer::Error(&(this->super_Parser).lexer_,&local_2a8,err);
        std::__cxx11::string::~string((string *)&local_2a8);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&in.parsed_.
                           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        local_50 = 1;
      }
      else {
        EvalString::EvalString((EvalString *)local_2c8);
        bVar3 = Lexer::ReadPath(&(this->super_Parser).lexer_,(EvalString *)local_2c8,err);
        if (bVar3) {
          bVar3 = EvalString::empty((EvalString *)local_2c8);
          if (bVar3) {
            local_50 = 0;
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_2e8,"explicit inputs not supported",
                       (allocator<char> *)
                       ((long)&ins.super__Vector_base<EvalString,_std::allocator<EvalString>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
            this_local._7_1_ = Lexer::Error(&(this->super_Parser).lexer_,&local_2e8,err);
            std::__cxx11::string::~string((string *)&local_2e8);
            std::allocator<char>::~allocator
                      ((allocator<char> *)
                       ((long)&ins.super__Vector_base<EvalString,_std::allocator<EvalString>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
            local_50 = 1;
          }
        }
        else {
          this_local._7_1_ = 0;
          local_50 = 1;
        }
        EvalString::~EvalString((EvalString *)local_2c8);
        if (local_50 == 0) {
          std::vector<EvalString,_std::allocator<EvalString>_>::vector
                    ((vector<EvalString,_std::allocator<EvalString>_> *)
                     &in_1.parsed_.
                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          bVar3 = Lexer::PeekToken(&(this->super_Parser).lexer_,PIPE);
          if (bVar3) {
            do {
              EvalString::EvalString((EvalString *)local_320);
              bVar3 = Lexer::ReadPath(&(this->super_Parser).lexer_,(EvalString *)local_320,err);
              if (bVar3) {
                bVar3 = EvalString::empty((EvalString *)local_320);
                if (bVar3) {
                  local_50 = 4;
                }
                else {
                  std::vector<EvalString,_std::allocator<EvalString>_>::push_back
                            ((vector<EvalString,_std::allocator<EvalString>_> *)
                             &in_1.parsed_.
                              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,
                             (value_type *)local_320);
                  local_50 = 0;
                }
              }
              else {
                this_local._7_1_ = err != (string *)0x0;
                local_50 = 1;
              }
              EvalString::~EvalString((EvalString *)local_320);
            } while (local_50 == 0);
            if (local_50 == 4) goto LAB_001d5bba;
          }
          else {
LAB_001d5bba:
            bVar3 = Lexer::PeekToken(&(this->super_Parser).lexer_,PIPE2);
            if (bVar3) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_340,"order-only inputs not supported",
                         (allocator<char> *)(key.field_2._M_local_buf + 0xf));
              this_local._7_1_ = Lexer::Error(&(this->super_Parser).lexer_,&local_340,err);
              std::__cxx11::string::~string((string *)&local_340);
              std::allocator<char>::~allocator((allocator<char> *)(key.field_2._M_local_buf + 0xf));
              local_50 = 1;
            }
            else {
              bVar3 = Parser::ExpectToken(&this->super_Parser,NEWLINE,err);
              if (bVar3) {
                bVar3 = Lexer::PeekToken(&(this->super_Parser).lexer_,INDENT);
                if (bVar3) {
                  key_00 = &val.parsed_.
                            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage;
                  std::__cxx11::string::string((string *)key_00);
                  EvalString::EvalString((EvalString *)local_380);
                  bVar3 = ParseLet(this,(string *)key_00,(EvalString *)local_380,err);
                  if (bVar3) {
                    bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)&val.parsed_.
                                                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                            "restat");
                    if (bVar3) {
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_3a0,"binding is not \'restat\'",
                                 (allocator<char> *)(value.field_2._M_local_buf + 0xf));
                      this_local._7_1_ = Lexer::Error(&(this->super_Parser).lexer_,&local_3a0,err);
                      std::__cxx11::string::~string((string *)&local_3a0);
                      std::allocator<char>::~allocator
                                ((allocator<char> *)(value.field_2._M_local_buf + 0xf));
                      local_50 = 1;
                    }
                    else {
                      EvalString::Evaluate_abi_cxx11_
                                ((string *)&i,(EvalString *)local_380,(Env *)&this->env_);
                      bVar4 = std::__cxx11::string::empty();
                      ((out0.parsed_.
                        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage)->first).field_0x1 =
                           (bVar4 ^ 0xff) & 1;
                      std::__cxx11::string::~string((string *)&i);
                      local_50 = 0;
                    }
                  }
                  else {
                    this_local._7_1_ = 0;
                    local_50 = 1;
                  }
                  EvalString::~EvalString((EvalString *)local_380);
                  std::__cxx11::string::~string
                            ((string *)
                             &val.parsed_.
                              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
                  if (local_50 != 0) goto LAB_001d6302;
                }
                pbVar2 = &(out0.parsed_.
                           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage)->first;
                sVar7 = std::vector<EvalString,_std::allocator<EvalString>_>::size
                                  ((vector<EvalString,_std::allocator<EvalString>_> *)
                                   &in_1.parsed_.
                                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
                std::vector<Node_*,_std::allocator<Node_*>_>::reserve
                          ((vector<Node_*,_std::allocator<Node_*>_> *)&pbVar2->_M_string_length,
                           sVar7);
                local_3d0._M_current =
                     (EvalString *)
                     std::vector<EvalString,_std::allocator<EvalString>_>::begin
                               ((vector<EvalString,_std::allocator<EvalString>_> *)
                                &in_1.parsed_.
                                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
                while( true ) {
                  path_1.field_2._8_8_ =
                       std::vector<EvalString,_std::allocator<EvalString>_>::end
                                 ((vector<EvalString,_std::allocator<EvalString>_> *)
                                  &in_1.parsed_.
                                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
                  bVar3 = __gnu_cxx::operator!=
                                    (&local_3d0,
                                     (__normal_iterator<EvalString_*,_std::vector<EvalString,_std::allocator<EvalString>_>_>
                                      *)((long)&path_1.field_2 + 8));
                  if (!bVar3) break;
                  pEVar8 = __gnu_cxx::
                           __normal_iterator<EvalString_*,_std::vector<EvalString,_std::allocator<EvalString>_>_>
                           ::operator->(&local_3d0);
                  EvalString::Evaluate_abi_cxx11_
                            ((string *)((long)&path_err_1.field_2 + 8),pEVar8,(Env *)&this->env_);
                  std::__cxx11::string::string((string *)&slash_bits_1);
                  bVar3 = CanonicalizePath((string *)((long)&path_err_1.field_2 + 8),(uint64_t *)&n,
                                           (string *)&slash_bits_1);
                  if (bVar3) {
                    pSVar1 = (this->super_Parser).state_;
                    StringPiece::StringPiece
                              ((StringPiece *)&i_1,(string *)((long)&path_err_1.field_2 + 8));
                    local_428 = State::GetNode(pSVar1,_i_1,&this->env_,(uint64_t)n);
                    std::vector<Node_*,_std::allocator<Node_*>_>::push_back
                              ((vector<Node_*,_std::allocator<Node_*>_> *)
                               &((out0.parsed_.
                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage)->first).
                                _M_string_length,&local_428);
                  }
                  else {
                    this_local._7_1_ =
                         Lexer::Error(&(this->super_Parser).lexer_,(string *)&slash_bits_1,err);
                  }
                  local_50 = (uint)!bVar3;
                  std::__cxx11::string::~string((string *)&slash_bits_1);
                  std::__cxx11::string::~string((string *)(path_err_1.field_2._M_local_buf + 8));
                  if (local_50 != 0) goto LAB_001d6302;
                  __gnu_cxx::
                  __normal_iterator<EvalString_*,_std::vector<EvalString,_std::allocator<EvalString>_>_>
                  ::operator++(&local_3d0);
                }
                this_02 = &(out0.parsed_.
                            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage)->second;
                sVar7 = std::vector<EvalString,_std::allocator<EvalString>_>::size
                                  ((vector<EvalString,_std::allocator<EvalString>_> *)
                                   &out_1.parsed_.
                                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
                std::vector<Node_*,_std::allocator<Node_*>_>::reserve
                          ((vector<Node_*,_std::allocator<Node_*>_> *)this_02,sVar7);
                local_440._M_current =
                     (EvalString *)
                     std::vector<EvalString,_std::allocator<EvalString>_>::begin
                               ((vector<EvalString,_std::allocator<EvalString>_> *)
                                &out_1.parsed_.
                                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
                while( true ) {
                  path_2.field_2._8_8_ =
                       std::vector<EvalString,_std::allocator<EvalString>_>::end
                                 ((vector<EvalString,_std::allocator<EvalString>_> *)
                                  &out_1.parsed_.
                                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
                  bVar3 = __gnu_cxx::operator!=
                                    (&local_440,
                                     (__normal_iterator<EvalString_*,_std::vector<EvalString,_std::allocator<EvalString>_>_>
                                      *)((long)&path_2.field_2 + 8));
                  if (!bVar3) break;
                  pEVar8 = __gnu_cxx::
                           __normal_iterator<EvalString_*,_std::vector<EvalString,_std::allocator<EvalString>_>_>
                           ::operator->(&local_440);
                  EvalString::Evaluate_abi_cxx11_
                            ((string *)((long)&path_err_2.field_2 + 8),pEVar8,(Env *)&this->env_);
                  std::__cxx11::string::string((string *)&slash_bits_2);
                  bVar3 = CanonicalizePath((string *)((long)&path_err_2.field_2 + 8),
                                           (uint64_t *)&n_1,(string *)&slash_bits_2);
                  if (bVar3) {
                    pSVar1 = (this->super_Parser).state_;
                    StringPiece::StringPiece(&local_4a8,(string *)((long)&path_err_2.field_2 + 8));
                    local_498 = State::GetNode(pSVar1,local_4a8,&this->env_,(uint64_t)n_1);
                    std::vector<Node_*,_std::allocator<Node_*>_>::push_back
                              ((vector<Node_*,_std::allocator<Node_*>_> *)
                               &(out0.parsed_.
                                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage)->second,
                               &local_498);
                  }
                  else {
                    this_local._7_1_ =
                         Lexer::Error(&(this->super_Parser).lexer_,(string *)&slash_bits_2,err);
                  }
                  local_50 = (uint)!bVar3;
                  std::__cxx11::string::~string((string *)&slash_bits_2);
                  std::__cxx11::string::~string((string *)(path_err_2.field_2._M_local_buf + 8));
                  if (local_50 != 0) goto LAB_001d6302;
                  __gnu_cxx::
                  __normal_iterator<EvalString_*,_std::vector<EvalString,_std::allocator<EvalString>_>_>
                  ::operator++(&local_440);
                }
                this_local._7_1_ = 1;
                local_50 = 1;
              }
              else {
                this_local._7_1_ = 0;
                local_50 = 1;
              }
            }
          }
LAB_001d6302:
          std::vector<EvalString,_std::allocator<EvalString>_>::~vector
                    ((vector<EvalString,_std::allocator<EvalString>_> *)
                     &in_1.parsed_.
                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
      }
      std::__cxx11::string::~string((string *)local_288);
    }
    else {
      this_local._7_1_ = 0;
      local_50 = 1;
    }
  }
  std::vector<EvalString,_std::allocator<EvalString>_>::~vector
            ((vector<EvalString,_std::allocator<EvalString>_> *)
             &out_1.parsed_.
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
LAB_001d6356:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool DyndepParser::ParseEdge(string* err) {
  // Parse one explicit output.  We expect it to already have an edge.
  // We will record its dynamically-discovered dependency information.
  Dyndeps* dyndeps = NULL;
  {
    EvalString out0;
    if (!lexer_.ReadPath(&out0, err))
      return false;
    if (out0.empty())
      return lexer_.Error("expected path", err);

    string path = out0.Evaluate(&env_);
    string path_err;
    uint64_t slash_bits;
    if (!CanonicalizePath(&path, &slash_bits, &path_err))
      return lexer_.Error(path_err, err);
    Node* node = state_->LookupNode(path);
    if (!node || !node->in_edge())
      return lexer_.Error("no build statement exists for '" + path + "'", err);
    Edge* edge = node->in_edge();
    std::pair<DyndepFile::iterator, bool> res =
      dyndep_file_->insert(DyndepFile::value_type(edge, Dyndeps()));
    if (!res.second)
      return lexer_.Error("multiple statements for '" + path + "'", err);
    dyndeps = &res.first->second;
  }

  // Disallow explicit outputs.
  {
    EvalString out;
    if (!lexer_.ReadPath(&out, err))
      return false;
    if (!out.empty())
      return lexer_.Error("explicit outputs not supported", err);
  }

  // Parse implicit outputs, if any.
  vector<EvalString> outs;
  if (lexer_.PeekToken(Lexer::PIPE)) {
    for (;;) {
      EvalString out;
      if (!lexer_.ReadPath(&out, err))
        return err;
      if (out.empty())
        break;
      outs.push_back(out);
    }
  }

  if (!ExpectToken(Lexer::COLON, err))
    return false;

  string rule_name;
  if (!lexer_.ReadIdent(&rule_name) || rule_name != "dyndep")
    return lexer_.Error("expected build command name 'dyndep'", err);

  // Disallow explicit inputs.
  {
    EvalString in;
    if (!lexer_.ReadPath(&in, err))
      return false;
    if (!in.empty())
      return lexer_.Error("explicit inputs not supported", err);
  }

  // Parse implicit inputs, if any.
  vector<EvalString> ins;
  if (lexer_.PeekToken(Lexer::PIPE)) {
    for (;;) {
      EvalString in;
      if (!lexer_.ReadPath(&in, err))
        return err;
      if (in.empty())
        break;
      ins.push_back(in);
    }
  }

  // Disallow order-only inputs.
  if (lexer_.PeekToken(Lexer::PIPE2))
    return lexer_.Error("order-only inputs not supported", err);

  if (!ExpectToken(Lexer::NEWLINE, err))
    return false;

  if (lexer_.PeekToken(Lexer::INDENT)) {
    string key;
    EvalString val;
    if (!ParseLet(&key, &val, err))
      return false;
    if (key != "restat")
      return lexer_.Error("binding is not 'restat'", err);
    string value = val.Evaluate(&env_);
    dyndeps->restat_ = !value.empty();
  }

  dyndeps->implicit_inputs_.reserve(ins.size());
  for (vector<EvalString>::iterator i = ins.begin(); i != ins.end(); ++i) {
    string path = i->Evaluate(&env_);
    string path_err;
    uint64_t slash_bits;
    if (!CanonicalizePath(&path, &slash_bits, &path_err))
      return lexer_.Error(path_err, err);
    Node* n = state_->GetNode(path, &env_, slash_bits);
    dyndeps->implicit_inputs_.push_back(n);
  }

  dyndeps->implicit_outputs_.reserve(outs.size());
  for (vector<EvalString>::iterator i = outs.begin(); i != outs.end(); ++i) {
    string path = i->Evaluate(&env_);
    string path_err;
    uint64_t slash_bits;
    if (!CanonicalizePath(&path, &slash_bits, &path_err))
      return lexer_.Error(path_err, err);
    Node* n = state_->GetNode(path, &env_, slash_bits);
    dyndeps->implicit_outputs_.push_back(n);
  }

  return true;
}